

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint64_t helper_tre(CPUS390XState_conflict *env,uint64_t array,uint64_t len,uint64_t trans)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint32_t local_4c;
  uint8_t new_byte;
  uint8_t byte;
  ulong uStack_48;
  uint32_t cc;
  uint64_t i;
  uint64_t l;
  uint8_t end;
  uintptr_t ra;
  uint64_t trans_local;
  uint64_t len_local;
  uint64_t array_local;
  CPUS390XState_conflict *env_local;
  
  uVar1 = env->regs[0];
  local_4c = 0;
  i = len;
  len_local = array;
  if (((env->psw).mask & 0x100000000) == 0) {
    len_local = array & 0x7fffffff;
    i = len & 0xffffffff;
  }
  if (0x2000 < i) {
    i = 0x2000;
    local_4c = 3;
  }
  uStack_48 = 0;
  do {
    if (i <= uStack_48) {
LAB_0124fb9c:
      env->cc_op = local_4c;
      env->retxl = len - uStack_48;
      return len_local + uStack_48;
    }
    uVar2 = cpu_ldub_data_ra_s390x(env,len_local + uStack_48,unaff_retaddr);
    if ((uVar2 & 0xff) == (uint)(byte)uVar1) {
      local_4c = 1;
      goto LAB_0124fb9c;
    }
    uVar2 = cpu_ldub_data_ra_s390x(env,trans + (byte)uVar2,unaff_retaddr);
    cpu_stb_data_ra_s390x(env,len_local + uStack_48,uVar2 & 0xff,unaff_retaddr);
    uStack_48 = uStack_48 + 1;
  } while( true );
}

Assistant:

uint64_t HELPER(tre)(CPUS390XState *env, uint64_t array,
                     uint64_t len, uint64_t trans)
{
    uintptr_t ra = GETPC();
    uint8_t end = env->regs[0] & 0xff;
    uint64_t l = len;
    uint64_t i;
    uint32_t cc = 0;

    if (!(env->psw.mask & PSW_MASK_64)) {
        array &= 0x7fffffff;
        l = (uint32_t)l;
    }

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    if (l > 0x2000) {
        l = 0x2000;
        cc = 3;
    }

    for (i = 0; i < l; i++) {
        uint8_t byte, new_byte;

        byte = cpu_ldub_data_ra(env, array + i, ra);

        if (byte == end) {
            cc = 1;
            break;
        }

        new_byte = cpu_ldub_data_ra(env, trans + byte, ra);
        cpu_stb_data_ra(env, array + i, new_byte, ra);
    }

    env->cc_op = cc;
    env->retxl = len - i;
    return array + i;
}